

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerSetJournalMode(Pager *pPager,int eMode)

{
  byte bVar1;
  uint uVar2;
  uint in_ESI;
  Pager *in_RDI;
  int state;
  int rc;
  u8 eOld;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int eLock;
  undefined3 in_stack_fffffffffffffff0;
  undefined4 uVar3;
  
  bVar1 = in_RDI->journalMode;
  uVar3 = CONCAT13(bVar1,in_stack_fffffffffffffff0);
  if (((in_RDI->memDb != '\0') && (in_ESI != 4)) && (in_ESI != 2)) {
    in_ESI = (uint)bVar1;
  }
  if (in_ESI != bVar1) {
    in_RDI->journalMode = (u8)in_ESI;
    if (((in_RDI->exclusiveMode == '\0') && ((bVar1 & 5) == 1)) && ((in_ESI & 1) == 0)) {
      sqlite3OsClose((sqlite3_file *)0x18c51a);
      if (in_RDI->eLock < 2) {
        eLock = 0;
        uVar2 = (uint)in_RDI->eState;
        if (uVar2 == 0) {
          eLock = sqlite3PagerSharedLock(in_RDI);
        }
        if (in_RDI->eState == '\x01') {
          eLock = pagerLockDb((Pager *)CONCAT44(in_ESI,uVar3),eLock);
        }
        if (eLock == 0) {
          sqlite3OsDelete((sqlite3_vfs *)CONCAT44(in_ESI,uVar3),(char *)(ulong)uVar2,0);
        }
        if ((eLock == 0) && (uVar2 == 1)) {
          pagerUnlockDb((Pager *)CONCAT44(in_ESI,uVar3),0);
        }
        else if (uVar2 == 0) {
          pager_unlock((Pager *)CONCAT44(in_ESI,uVar3));
        }
      }
      else {
        sqlite3OsDelete((sqlite3_vfs *)CONCAT44(in_ESI,uVar3),
                        (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
      }
    }
    else if ((in_ESI == 2) || (in_ESI == 4)) {
      sqlite3OsClose((sqlite3_file *)0x18c603);
    }
  }
  return (int)in_RDI->journalMode;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSetJournalMode(Pager *pPager, int eMode){
  u8 eOld = pPager->journalMode;    /* Prior journalmode */

  /* The eMode parameter is always valid */
  assert(      eMode==PAGER_JOURNALMODE_DELETE    /* 0 */
            || eMode==PAGER_JOURNALMODE_PERSIST   /* 1 */
            || eMode==PAGER_JOURNALMODE_OFF       /* 2 */
            || eMode==PAGER_JOURNALMODE_TRUNCATE  /* 3 */
            || eMode==PAGER_JOURNALMODE_MEMORY    /* 4 */
            || eMode==PAGER_JOURNALMODE_WAL       /* 5 */ );

  /* This routine is only called from the OP_JournalMode opcode, and
  ** the logic there will never allow a temporary file to be changed
  ** to WAL mode.
  */
  assert( pPager->tempFile==0 || eMode!=PAGER_JOURNALMODE_WAL );

  /* Do allow the journalmode of an in-memory database to be set to
  ** anything other than MEMORY or OFF
  */
  if( MEMDB ){
    assert( eOld==PAGER_JOURNALMODE_MEMORY || eOld==PAGER_JOURNALMODE_OFF );
    if( eMode!=PAGER_JOURNALMODE_MEMORY && eMode!=PAGER_JOURNALMODE_OFF ){
      eMode = eOld;
    }
  }

  if( eMode!=eOld ){

    /* Change the journal mode. */
    assert( pPager->eState!=PAGER_ERROR );
    pPager->journalMode = (u8)eMode;

    /* When transitioning from TRUNCATE or PERSIST to any other journal
    ** mode except WAL, unless the pager is in locking_mode=exclusive mode,
    ** delete the journal file.
    */
    assert( (PAGER_JOURNALMODE_TRUNCATE & 5)==1 );
    assert( (PAGER_JOURNALMODE_PERSIST & 5)==1 );
    assert( (PAGER_JOURNALMODE_DELETE & 5)==0 );
    assert( (PAGER_JOURNALMODE_MEMORY & 5)==4 );
    assert( (PAGER_JOURNALMODE_OFF & 5)==0 );
    assert( (PAGER_JOURNALMODE_WAL & 5)==5 );

    assert( isOpen(pPager->fd) || pPager->exclusiveMode );
    if( !pPager->exclusiveMode && (eOld & 5)==1 && (eMode & 1)==0 ){
      /* In this case we would like to delete the journal file. If it is
      ** not possible, then that is not a problem. Deleting the journal file
      ** here is an optimization only.
      **
      ** Before deleting the journal file, obtain a RESERVED lock on the
      ** database file. This ensures that the journal file is not deleted
      ** while it is in use by some other client.
      */
      sqlite3OsClose(pPager->jfd);
      if( pPager->eLock>=RESERVED_LOCK ){
        sqlite3OsDelete(pPager->pVfs, pPager->zJournal, 0);
      }else{
        int rc = SQLITE_OK;
        int state = pPager->eState;
        assert( state==PAGER_OPEN || state==PAGER_READER );
        if( state==PAGER_OPEN ){
          rc = sqlite3PagerSharedLock(pPager);
        }
        if( pPager->eState==PAGER_READER ){
          assert( rc==SQLITE_OK );
          rc = pagerLockDb(pPager, RESERVED_LOCK);
        }
        if( rc==SQLITE_OK ){
          sqlite3OsDelete(pPager->pVfs, pPager->zJournal, 0);
        }
        if( rc==SQLITE_OK && state==PAGER_READER ){
          pagerUnlockDb(pPager, SHARED_LOCK);
        }else if( state==PAGER_OPEN ){
          pager_unlock(pPager);
        }
        assert( state==pPager->eState );
      }
    }else if( eMode==PAGER_JOURNALMODE_OFF || eMode==PAGER_JOURNALMODE_MEMORY ){
      sqlite3OsClose(pPager->jfd);
    }
  }

  /* Return the new journal mode */
  return (int)pPager->journalMode;
}